

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::ConfigBlockSymbol::resolve(ConfigBlockSymbol *this)

{
  char_pointer puVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  char *pcVar5;
  char *pcVar6;
  group_type_pointer pgVar7;
  group_type_pointer pgVar8;
  char_pointer puVar9;
  char_pointer puVar10;
  undefined4 uVar11;
  _Alloc_hider _Var12;
  ParameterValueAssignmentSyntax *pPVar13;
  group_type_pointer pgVar14;
  long lVar15;
  ConfigLiblistSyntax *pCVar16;
  _func_int **pp_Var17;
  size_t __n;
  void *__s1;
  size_t sVar18;
  ConfigRule *pCVar19;
  group_type_pointer pgVar20;
  value_type_pointer ppVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  SourceLocation SVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  BumpAllocator *pBVar31;
  char **ppcVar32;
  Scope *pSVar33;
  group_type_pointer pgVar34;
  char_pointer puVar35;
  value_type_pointer ppVar36;
  int iVar37;
  DefinitionSymbol *args;
  uint64_t uVar38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar39;
  SyntaxNode *pSVar40;
  group_type_pointer pgVar41;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *paVar42;
  Diagnostic *pDVar43;
  _Alloc_hider _Var44;
  undefined4 extraout_var;
  ulong uVar45;
  char_pointer puVar46;
  long lVar47;
  char_pointer puVar48;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar49;
  value_type_pointer ppVar50;
  value_type *elements_4;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *ptVar51;
  ConfigBlockSymbol *extraout_RDX;
  ConfigBlockSymbol *extraout_RDX_00;
  size_t extraout_RDX_01;
  uint uVar53;
  undefined8 *puVar54;
  value_type_pointer ppVar55;
  try_emplace_args_t *ptVar56;
  table_element_pointer ppVar57;
  Info *pIVar58;
  ConfigBlockSymbol *pCVar59;
  table_element_pointer_conflict ppVar60;
  undefined8 uVar61;
  group_type_pointer pgVar62;
  char_pointer puVar63;
  value_type_pointer ppVar64;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar65;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar66;
  ulong uVar67;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar68;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *ptVar69;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *ptVar70;
  ulong uVar71;
  Compilation *pCVar72;
  long *plVar73;
  char_pointer puVar74;
  char_pointer puVar75;
  Token *pTVar76;
  ConfigUseClauseSyntax *cuc;
  Compilation *pCVar77;
  bool bVar78;
  char cVar79;
  uchar uVar80;
  char cVar92;
  char cVar94;
  char cVar96;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uchar uVar93;
  uchar uVar95;
  uchar uVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  string_view sVar109;
  string_view libName;
  span<const_slang::SourceLibrary_*,_18446744073709551615UL> sVar110;
  SourceRange SVar111;
  iterator iVar112;
  iterator iVar113;
  iterator_conflict iVar114;
  iterator iVar115;
  string_view fmt;
  string_view fmt_00;
  format_args args_00;
  format_args args_01;
  string_view topName;
  string_view cellName;
  value_type *elements_1;
  value_type *elements_2;
  value_type *elements_3;
  Scope *scope;
  value_type *elements;
  ConfigRule *rule;
  locator res;
  SourceLibrary *specificLib;
  anon_class_16_2_f7902cf0 buildLiblist;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_2UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
  topCellNames;
  SmallVector<slang::ast::ConfigBlockSymbol::TopCell,_2UL> topCellsBuf;
  string_view local_2b8;
  string_view local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_280;
  group_type_pointer local_278;
  value_type_pointer local_270;
  undefined1 local_268 [16];
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *local_250;
  value_type_pointer local_248;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_240;
  Compilation *local_238;
  Scope *local_230;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_228;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1f0;
  undefined1 local_1e8 [16];
  _Alloc_hider local_1d0;
  _Storage<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true> local_1c8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1b8;
  string_view local_1b0;
  string_view local_1a0;
  SourceRange local_190;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_180;
  long local_178;
  SyntaxNode *local_170;
  undefined1 local_168;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_158;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *local_150;
  long *local_148;
  SourceLibrary *local_140;
  anon_class_16_2_f7902cf0 local_138;
  undefined1 local_128 [48];
  SourceLocation local_f8;
  SourceLocation local_f0;
  arrays_type local_e8;
  ulong local_c8;
  ulong local_c0;
  long local_b0;
  ulong local_a8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
  *local_a0;
  SourceRange local_98;
  undefined1 local_88 [88];
  ConfigBlockSymbol *src;
  table_element_pointer ppVar52;
  
  this->resolved = true;
  local_230 = (this->super_Symbol).parentScope;
  local_238 = local_230->compilation;
  local_288 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
              (this->super_Symbol).originatingSyntax;
  local_f8 = (SourceLocation)local_128;
  local_e8.groups_size_index = 0x3f;
  local_e8.groups_size_mask = 1;
  local_e8.elements_ = (value_type_pointer)0x0;
  ppVar36 = local_e8.elements_;
  local_e8.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_e8.elements_ = (value_type_pointer)0x0;
  local_c8 = 0;
  local_c0 = 0;
  local_88._0_8_ = local_88 + 0x18;
  local_88._8_8_ = (Compilation *)0x0;
  local_88._16_8_ = 2;
  local_f0 = local_f8;
  if (((Token *)(local_288.values_ + 0xf))->info != (Info *)0x0) {
    puVar54 = *(undefined8 **)(local_288.values_ + 0xf);
    puVar3 = puVar54 + (long)((Token *)(local_288.values_ + 0xf))->info;
    do {
      pSVar40 = (SyntaxNode *)*puVar54;
      sVar109 = parsing::Token::valueText((Token *)&pSVar40[2].parent);
      local_2a8 = sVar109;
      if (sVar109._M_len != 0) {
        local_1e8._0_8_ = &pSVar40[2].parent;
        libName = parsing::Token::valueText((Token *)(pSVar40 + 1));
        local_98 = slang::syntax::SyntaxNode::sourceRange(pSVar40);
        args = Compilation::getDefinition(local_238,this,sVar109,libName,local_98);
        if (args != (DefinitionSymbol *)0x0) {
          local_138.comp = (Compilation *)local_88._8_8_;
          aVar65 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_f0,
                              (basic_string_view<char,_std::char_traits<char>_> *)&local_2a8);
          pgVar34 = local_e8.groups_;
          ppVar50 = (value_type_pointer)
                    ((ulong)aVar65.values_ >> ((byte)local_e8.groups_size_index & 0x3f));
          uVar11 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[(ulong)aVar65.values_ & 0xff];
          auVar98._4_4_ = uVar11;
          auVar98._0_4_ = uVar11;
          auVar98._8_4_ = uVar11;
          auVar98._12_4_ = uVar11;
          local_220 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      local_e8.elements_;
          sVar18 = local_2a8._M_len;
          local_208._0_8_ = local_2a8._M_str;
          pgVar41 = (group_type_pointer)(ulong)(aVar65._0_4_ & 7);
          aVar39.values_ = (value<fmt::v11::context> *)0x0;
          aVar66 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   local_e8.groups_size_mask;
          ppVar55 = ppVar50;
          pTVar76 = (Token *)local_1e8._0_8_;
          do {
            aVar68 = local_220;
            pgVar62 = pgVar34 + (long)ppVar50;
            auVar81[0] = -(pgVar62->m[0].n == auVar98[0]);
            auVar81[1] = -(pgVar62->m[1].n == auVar98[1]);
            auVar81[2] = -(pgVar62->m[2].n == auVar98[2]);
            auVar81[3] = -(pgVar62->m[3].n == auVar98[3]);
            auVar81[4] = -(pgVar62->m[4].n == auVar98[4]);
            auVar81[5] = -(pgVar62->m[5].n == auVar98[5]);
            auVar81[6] = -(pgVar62->m[6].n == auVar98[6]);
            auVar81[7] = -(pgVar62->m[7].n == auVar98[7]);
            auVar81[8] = -(pgVar62->m[8].n == auVar98[8]);
            auVar81[9] = -(pgVar62->m[9].n == auVar98[9]);
            auVar81[10] = -(pgVar62->m[10].n == auVar98[10]);
            auVar81[0xb] = -(pgVar62->m[0xb].n == auVar98[0xb]);
            auVar81[0xc] = -(pgVar62->m[0xc].n == auVar98[0xc]);
            auVar81[0xd] = -(pgVar62->m[0xd].n == auVar98[0xd]);
            auVar81[0xe] = -(pgVar62->m[0xe].n == auVar98[0xe]);
            auVar81[0xf] = -(pgVar62->m[0xf].n == auVar98[0xf]);
            uVar53 = (uint)(ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe);
            ppVar64 = ppVar50;
            aVar49 = aVar39;
            ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                       *)((long)ppVar50 * 0x10);
            if (uVar53 != 0) {
              local_280 = aVar66;
              local_278 = pgVar41;
              local_270 = ppVar55;
              local_268 = auVar98;
              local_250 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                           *)((long)ppVar50 * 0x10);
              local_248 = ppVar50;
              local_240 = aVar65;
              local_1f0 = aVar39;
              do {
                uVar22 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                ptVar56 = (try_emplace_args_t *)
                          ((long)aVar68.values_ + (ulong)uVar22 * 0x18 + (long)ppVar50 * 0x168);
                bVar78 = (pointer)sVar18 == *(pointer *)ptVar56;
                if (bVar78 && (pointer)sVar18 != (pointer)0x0) {
                  iVar37 = bcmp((void *)local_208._0_8_,*(void **)(ptVar56 + 8),sVar18);
                  bVar78 = iVar37 == 0;
                  auVar98 = local_268;
                }
                aVar65 = local_240;
                ppVar55 = local_270;
                pTVar76 = (Token *)local_1e8._0_8_;
                if (bVar78) {
                  local_218._0_8_ = ptVar56;
                  goto LAB_0044f9f5;
                }
                uVar53 = uVar53 - 1 & uVar53;
                pgVar41 = local_278;
                aVar66 = local_280;
                ppVar64 = local_248;
                aVar49 = local_1f0;
                ptVar51 = local_250;
              } while (uVar53 != 0);
            }
            if (((byte)(ptVar51 + (long)pgVar34)[0xf] & pgVar41[0x47ff5].m[0].n) == 0) break;
            aVar39.values_ = (value<fmt::v11::context> *)((long)&(aVar49.values_)->field_0 + 1);
            ppVar50 = (value_type_pointer)
                      ((ulong)((try_emplace_args_t *)
                               ((long)&(ppVar64->first)._M_len + (long)aVar49.values_) + 1) &
                      (ulong)aVar66.values_);
          } while (aVar39.values_ <= aVar66.values_);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_218._8_8_;
          local_218 = auVar29 << 0x40;
LAB_0044f9f5:
          pSVar33 = local_230;
          if (local_218._0_8_ == 0) {
            if (local_c0 < local_c8) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        ((locator *)&local_1c8._M_value,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                          *)&local_f0,&local_e8,(size_t)ppVar55,(size_t)aVar65,
                         (try_emplace_args_t *)&local_2b8,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_2a8,
                         (unsigned_long *)&local_138);
              local_c0 = local_c0 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        ((locator *)&local_1c8._M_value,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,48ul,16ul>>
                          *)&local_f0,(size_t)aVar65,(try_emplace_args_t *)&local_2b8,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_2a8,
                         (unsigned_long *)&local_138);
            }
            local_1c8._M_value =
                 (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
                 slang::syntax::SyntaxNode::sourceRange(pSVar40);
            SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
            emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
                      ((SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *)local_88,args,
                       (SourceRange *)&local_1c8._M_value);
          }
          else {
            SVar111 = parsing::Token::range(pTVar76);
            pDVar43 = Scope::addDiag(pSVar33,(DiagCode)0x190006,SVar111);
            Diagnostic::operator<<(pDVar43,local_2a8);
          }
        }
      }
      puVar54 = puVar54 + 1;
      ppVar36 = local_e8.elements_;
    } while (puVar54 != puVar3);
  }
  local_e8.elements_ = ppVar36;
  local_138.comp = local_238;
  local_138.scope = &local_230;
  _Var12._M_p = (((string *)(local_288.values_ + 0x14))->_M_dataplus)._M_p;
  if (_Var12._M_p != (pointer)0x0) {
    pIVar58 = ((Token *)(local_288.values_ + 0x13))->info;
    ppcVar32 = &pIVar58->rawTextPtr;
    local_270 = (value_type_pointer)&this->instanceOverrides;
    local_240.values_ = (value<fmt::v11::context> *)&this->cellOverrides;
    do {
      ppVar55 = (value_type_pointer)pIVar58->rawTextPtr;
      iVar37 = *(int *)&(ppVar55->first)._M_len;
      if (iVar37 == 0x41) {
        local_2b8 = parsing::Token::valueText
                              ((Token *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)((long)&ppVar55->second + 0x18))->_M_allocated_capacity
                                        + 0x38));
        if (local_2b8._M_len != 0) {
          pCVar16 = (ConfigLiblistSyntax *)
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&ppVar55->second)[2]._M_allocated_capacity;
          local_170 = (pCVar16->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent;
          local_1b8.args_ = local_1b8.args_ & 0xffffffffffffff00;
          local_180._0_1_ = 0;
          local_190.startLoc = (SourceLocation)0x0;
          local_190.endLoc = (SourceLocation)0x0;
          local_1a0._M_len = 0;
          local_1a0._M_str = (char *)0x0;
          local_1b0._M_len = 0;
          local_1b0._M_str = (char *)0x0;
          local_178 = 0;
          local_168 = 0;
          if ((pCVar16->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind == ConfigUseClause) {
            local_178 = *(long *)&(pCVar16->libraries).super_SyntaxListBase.super_SyntaxNode;
            pp_Var17 = (pCVar16->libraries).super_SyntaxListBase._vptr_SyntaxListBase;
            if ((pp_Var17 != (_func_int **)0x0) &&
               (sVar109 = parsing::Token::valueText((Token *)(pp_Var17 + 7)), sVar109._M_len != 0))
            {
              local_1b0 = parsing::Token::valueText
                                    ((Token *)((pCVar16->libraries).super_SyntaxListBase.
                                               _vptr_SyntaxListBase + 3));
              local_1a0 = parsing::Token::valueText
                                    ((Token *)((pCVar16->libraries).super_SyntaxListBase.
                                               _vptr_SyntaxListBase + 7));
              local_190 = slang::syntax::SyntaxNode::sourceRange
                                    ((SyntaxNode *)
                                     (pCVar16->libraries).super_SyntaxListBase._vptr_SyntaxListBase)
              ;
              paVar42 = &local_180;
              if ((pCVar16->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>.
                  _M_ptr != (pointer)0x0) goto LAB_0044fed5;
            }
          }
          else {
            local_1c8._M_value =
                 (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
                 resolve::anon_class_16_2_f7902cf0::operator()(&local_138,pCVar16);
            paVar42 = &local_1b8;
LAB_0044fed5:
            *(undefined1 *)paVar42 = 1;
          }
          local_1d0._M_p =
               (pointer)BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule>
                                  (&local_238->super_BumpAllocator,(ConfigRule *)&local_1c8._M_value
                                  );
          aVar39.args_ = (basic_format_arg<fmt::v11::context> *)
                         hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()(local_240.args_,&local_2b8);
          aVar68.values_ =
               (value<fmt::v11::context> *)
               ((ulong)aVar39.values_ >>
               ((byte)(this->cellOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                      .arrays.groups_size_index & 0x3f));
          pgVar41 = (this->cellOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                    .arrays.groups_;
          uVar11 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[(ulong)aVar39.values_ & 0xff];
          auVar100._4_4_ = uVar11;
          auVar100._0_4_ = uVar11;
          auVar100._8_4_ = uVar11;
          auVar100._12_4_ = uVar11;
          local_268._0_8_ =
               (this->cellOverrides).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               .arrays.elements_;
          sVar18 = local_2b8._M_len;
          pcVar5 = local_2b8._M_str;
          aVar66._0_4_ = aVar39._0_4_ & 7;
          aVar66._4_4_ = 0;
          ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                     *)(this->cellOverrides).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                       .arrays.groups_size_mask;
          ptVar69 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                     *)0x0;
          aVar65.values_ = aVar68.values_;
          do {
            pgVar62 = pgVar41 + (long)aVar65;
            auVar83[0] = -(pgVar62->m[0].n == auVar100[0]);
            auVar83[1] = -(pgVar62->m[1].n == auVar100[1]);
            auVar83[2] = -(pgVar62->m[2].n == auVar100[2]);
            auVar83[3] = -(pgVar62->m[3].n == auVar100[3]);
            auVar83[4] = -(pgVar62->m[4].n == auVar100[4]);
            auVar83[5] = -(pgVar62->m[5].n == auVar100[5]);
            auVar83[6] = -(pgVar62->m[6].n == auVar100[6]);
            auVar83[7] = -(pgVar62->m[7].n == auVar100[7]);
            auVar83[8] = -(pgVar62->m[8].n == auVar100[8]);
            auVar83[9] = -(pgVar62->m[9].n == auVar100[9]);
            auVar83[10] = -(pgVar62->m[10].n == auVar100[10]);
            auVar83[0xb] = -(pgVar62->m[0xb].n == auVar100[0xb]);
            auVar83[0xc] = -(pgVar62->m[0xc].n == auVar100[0xc]);
            auVar83[0xd] = -(pgVar62->m[0xd].n == auVar100[0xd]);
            auVar83[0xe] = -(pgVar62->m[0xe].n == auVar100[0xe]);
            auVar83[0xf] = -(pgVar62->m[0xf].n == auVar100[0xf]);
            uVar53 = (uint)(ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe);
            ptVar70 = ptVar69;
            plVar73 = (long *)((long)aVar65.values_ * 0x10);
            if (uVar53 != 0) {
              lVar47 = local_268._0_8_ + (long)aVar65.values_ * 0x438;
              local_288 = aVar39;
              local_280 = aVar66;
              local_278 = pgVar41;
              local_250 = ptVar51;
              local_228 = aVar65;
              local_208 = auVar100;
              local_150 = ptVar69;
              local_148 = (long *)((long)aVar65.values_ * 0x10);
              do {
                uVar22 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                psVar4 = (size_t *)(lVar47 + (ulong)uVar22 * 0x48);
                bVar78 = sVar18 == *psVar4;
                if (bVar78 && sVar18 != 0) {
                  iVar37 = bcmp(pcVar5,(void *)psVar4[1],sVar18);
                  bVar78 = iVar37 == 0;
                  auVar100 = local_208;
                }
                aVar39 = local_288;
                if (bVar78) {
                  local_218._0_8_ = psVar4;
                  goto LAB_0045010d;
                }
                uVar53 = uVar53 - 1 & uVar53;
                aVar66 = local_280;
                ptVar51 = local_250;
                pgVar41 = local_278;
                aVar65 = local_228;
                ptVar70 = local_150;
                plVar73 = local_148;
              } while (uVar53 != 0);
            }
            if ((pgVar41->m[(long)plVar73 + 0xf].n &
                (char)((Token *)(aVar66.values_ + 0x47ff5))->kind) == Unknown) break;
            ptVar69 = ptVar70 + 1;
            aVar65.values_ =
                 (value<fmt::v11::context> *)
                 ((ulong)(ptVar70 + (long)((long)&((aVar65.values_)->field_0).int_value + 1)) &
                 (ulong)ptVar51);
          } while (ptVar69 <= ptVar51);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_218._8_8_;
          local_218 = auVar30 << 0x40;
LAB_0045010d:
          aVar66 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                   local_218._0_8_;
          if ((value_type_pointer)local_218._0_8_ == (value_type_pointer)0x0) {
            if ((this->cellOverrides).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                .size_ctrl.size <
                (this->cellOverrides).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                .size_ctrl.ml) {
              aVar65.values_ = (value<fmt::v11::context> *)&local_2a8;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((locator *)&local_1c8._M_value,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                          *)local_240.values_,(arrays_type *)local_240,(size_t)aVar68,(size_t)aVar39
                         ,(try_emplace_args_t *)aVar65.values_,&local_2b8);
              psVar2 = &(this->cellOverrides).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                        .size_ctrl.size;
              *psVar2 = *psVar2 + 1;
              aVar66 = local_1b8;
              aVar68 = aVar65;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((locator *)&local_1c8._M_value,
                         (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::CellOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::CellOverride>>>
                          *)local_240.values_,(size_t)aVar39,(try_emplace_args_t *)&local_2a8,
                         &local_2b8);
              aVar66 = local_1b8;
            }
          }
          sVar109 = parsing::Token::valueText
                              ((Token *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)((long)&ppVar55->second + 0x18))->_M_allocated_capacity
                                        + 0x18));
          pSVar33 = local_230;
          if (sVar109._M_len == 0) {
            _Var44._M_p = (((string *)(aVar66.values_ + 4))->_M_dataplus)._M_p;
            if (_Var44._M_p == (pointer)0x0) {
              (((string *)(aVar66.values_ + 4))->_M_dataplus)._M_p = local_1d0._M_p;
            }
            else {
              pPVar13 = *(ParameterValueAssignmentSyntax **)(local_1d0._M_p + 0x50);
              if ((((pPVar13 == (ParameterValueAssignmentSyntax *)0x0) ||
                   (*(long *)(_Var44._M_p + 0x50) == 0)) &&
                  ((bVar78 = (bool)local_1d0._M_p[0x10], bVar78 != true ||
                   (_Var44._M_p[0x10] == '\0')))) &&
                 ((((string_view *)(local_1d0._M_p + 0x28))->_M_len == 0 ||
                  (*(long *)(_Var44._M_p + 0x28) == 0)))) {
                if (pPVar13 != (ParameterValueAssignmentSyntax *)0x0) {
                  *(ParameterValueAssignmentSyntax **)(_Var44._M_p + 0x50) = pPVar13;
                }
                if (bVar78 != false) {
                  *(undefined8 *)(_Var44._M_p + 0x10) = *(undefined8 *)(local_1d0._M_p + 0x10);
                  uVar61 = *(undefined8 *)(local_1d0._M_p + 8);
                  *(undefined8 *)_Var44._M_p = *(undefined8 *)local_1d0._M_p;
                  *(undefined8 *)(_Var44._M_p + 8) = uVar61;
                }
                if (((string_view *)(local_1d0._M_p + 0x28))->_M_len != 0) {
                  _Var44._M_p[0x48] = local_1d0._M_p[0x48];
                  sVar18 = (((CellId *)(local_1d0._M_p + 0x18))->lib)._M_len;
                  pcVar5 = *(char **)(local_1d0._M_p + 0x20);
                  auVar98 = *(undefined1 (*) [16])&((string_view *)(local_1d0._M_p + 0x28))->_M_len;
                  uVar61 = *(undefined8 *)&((SourceLocation *)(local_1d0._M_p + 0x40))->field_0x0;
                  *(SourceLocation *)(_Var44._M_p + 0x38) =
                       ((SourceRange *)(local_1d0._M_p + 0x38))->startLoc;
                  *(undefined8 *)(_Var44._M_p + 0x40) = uVar61;
                  *(undefined1 (*) [16])(_Var44._M_p + 0x28) = auVar98;
                  *(size_t *)(_Var44._M_p + 0x18) = sVar18;
                  *(char **)(_Var44._M_p + 0x20) = pcVar5;
                  *(SyntaxNode **)(_Var44._M_p + 0x58) =
                       ((not_null<const_slang::syntax::SyntaxNode_*> *)(local_1d0._M_p + 0x58))->ptr
                  ;
                }
              }
              else {
                SVar111 = slang::syntax::SyntaxNode::sourceRange
                                    (((not_null<const_slang::syntax::SyntaxNode_*> *)
                                     (local_1d0._M_p + 0x58))->ptr);
                pDVar43 = Scope::addDiag(pSVar33,(DiagCode)0xeb0006,SVar111);
                local_2a8._M_str = (char *)local_2b8._M_len;
                local_2a8._M_len = (size_t)local_2b8._M_str;
                fmt.size_ = 0xd;
                fmt.data_ = (char *)0x9;
                args_00.field_1.values_ = aVar68.values_;
                args_00.desc_ = (unsigned_long_long)&local_2a8;
                ::fmt::v11::vformat_abi_cxx11_
                          ((string *)&local_1c8._M_value,(v11 *)"cell \'{}\'",fmt,args_00);
                pDVar43 = Diagnostic::operator<<(pDVar43,(string *)&local_1c8._M_value);
                if ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                    local_1c8._M_value._M_ptr != &local_1b8) {
                  operator_delete(local_1c8._M_value._M_ptr,
                                  (size_t)((long)&(local_1b8.values_)->field_0 + 1));
                }
                SVar111 = slang::syntax::SyntaxNode::sourceRange
                                    (*(SyntaxNode **)(_Var44._M_p + 0x58));
                Diagnostic::addNote(pDVar43,(DiagCode)0xa0001,SVar111);
              }
            }
          }
          else {
            local_140 = Compilation::getSourceLibrary(local_238,sVar109);
            pSVar33 = local_230;
            if (local_140 == (SourceLibrary *)0x0) {
              SVar111 = parsing::Token::range
                                  ((Token *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)((long)&ppVar55->second + 0x18))->
                                             _M_allocated_capacity + 0x18));
              pDVar43 = Scope::addDiag(pSVar33,(DiagCode)0xff0006,SVar111);
              Diagnostic::operator<<(pDVar43,sVar109);
            }
            else {
              pTVar76 = (Token *)(aVar66.values_ + 1);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_140;
              uVar45 = SUB168(auVar23 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar23 * ZEXT816(0x9e3779b97f4a7c15),0);
              aVar39.values_ =
                   (value<fmt::v11::context> *)
                   (uVar45 >>
                   (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&(aVar66.args_)->type_)->_M_local_buf[0] & 0x3fU));
              _Var44._M_p = (((string *)(aVar66.values_ + 2))->_M_dataplus)._M_p;
              uVar11 = (&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word)[uVar45 & 0xff];
              uVar71 = 0;
              aVar65.values_ = aVar39.values_;
              do {
                pcVar5 = _Var44._M_p + (long)aVar65.values_ * 0x10;
                cVar79 = (char)uVar11;
                auVar101[0] = -(*pcVar5 == cVar79);
                cVar92 = (char)((uint)uVar11 >> 8);
                auVar101[1] = -(pcVar5[1] == cVar92);
                cVar94 = (char)((uint)uVar11 >> 0x10);
                auVar101[2] = -(pcVar5[2] == cVar94);
                cVar96 = (char)((uint)uVar11 >> 0x18);
                auVar101[3] = -(pcVar5[3] == cVar96);
                auVar101[4] = -(pcVar5[4] == cVar79);
                auVar101[5] = -(pcVar5[5] == cVar92);
                auVar101[6] = -(pcVar5[6] == cVar94);
                auVar101[7] = -(pcVar5[7] == cVar96);
                auVar101[8] = -(pcVar5[8] == cVar79);
                auVar101[9] = -(pcVar5[9] == cVar92);
                auVar101[10] = -(pcVar5[10] == cVar94);
                auVar101[0xb] = -(pcVar5[0xb] == cVar96);
                auVar101[0xc] = -(pcVar5[0xc] == cVar79);
                auVar101[0xd] = -(pcVar5[0xd] == cVar92);
                auVar101[0xe] = -(pcVar5[0xe] == cVar94);
                auVar101[0xf] = -(pcVar5[0xf] == cVar96);
                uVar53 = (uint)(ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar101 >> 0x77,0) & 1) << 0xe);
                if (uVar53 != 0) {
                  do {
                    iVar37 = 0;
                    if (uVar53 != 0) {
                      for (; (uVar53 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
                      }
                    }
                    if (local_140 ==
                        *(SourceLibrary **)
                         ((long)&((Info *)((string *)(aVar66.values_ + 2))->_M_string_length)
                                 [(long)aVar65.values_ * 0xf].rawTextPtr +
                         (ulong)(uint)(iVar37 << 4))) {
                      aVar68.values_ =
                           (value<fmt::v11::context> *)
                           ((long)&((Info *)((string *)(aVar66.values_ + 2))->_M_string_length)
                                   [(long)aVar65.values_ * 0xf].rawTextPtr +
                           (ulong)(uint)(iVar37 << 4));
                      local_220.values_ = aVar68.values_;
                      goto LAB_004503f2;
                    }
                    uVar53 = uVar53 - 1 & uVar53;
                  } while (uVar53 != 0);
                }
                if ((_Var44._M_p[(long)aVar65.values_ * 0x10 + 0xf] &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar45 & 7]) == 0) break;
                lVar47 = uVar71 + 1;
                uVar71 = uVar71 + 1;
                aVar65.values_ =
                     (value<fmt::v11::context> *)
                     ((ulong)(lVar47 + (long)&(aVar65.values_)->field_0) &
                     (ulong)((Token *)(aVar66.values_ + 1))->info);
              } while (uVar71 <= ((Token *)(aVar66.values_ + 1))->info);
              aVar68.values_ = (value<fmt::v11::context> *)0x0;
LAB_004503f2:
              aVar49 = aVar68;
              if ((value_type_pointer)aVar68.values_ == (value_type_pointer)0x0) {
                if (((Token *)(aVar66.values_ + 3))->info < *(Info **)(aVar66.values_ + 3)) {
                  aVar65.values_ = (value<fmt::v11::context> *)&local_2a8;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                            ((locator_conflict *)&local_1c8._M_value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                              *)pTVar76,(arrays_type *)pTVar76,(size_t)aVar39,uVar45,
                             (try_emplace_args_t *)aVar65.values_,&local_140,
                             (ConfigRule **)&local_1d0);
                  ((Token *)(aVar66.values_ + 3))->info =
                       (Info *)((long)&((Token *)(aVar66.values_ + 3))->info->rawTextPtr + 1);
                  aVar49 = local_1b8;
                }
                else {
                  aVar65.values_ = (value<fmt::v11::context> *)&local_1d0;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::SourceLibrary_const*&,slang::ast::ConfigRule*&>
                            ((locator_conflict *)&local_1c8._M_value,
                             (table_core<boost::unordered::detail::foa::flat_map_types<slang::SourceLibrary_const*,slang::ast::ConfigRule*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SourceLibrary_const*,void>,std::equal_to<slang::SourceLibrary_const*>,std::allocator<std::pair<slang::SourceLibrary_const*const,slang::ast::ConfigRule*>>>
                              *)pTVar76,uVar45,(try_emplace_args_t *)&local_2a8,&local_140,
                             (ConfigRule **)aVar65.values_);
                  aVar49 = local_1b8;
                }
              }
              pSVar33 = local_230;
              local_220 = aVar68;
              if ((value_type_pointer)aVar68.values_ != (value_type_pointer)0x0) {
                _Var44._M_p = *(pointer *)((long)&(aVar49.values_)->field_0 + 8);
                pPVar13 = *(ParameterValueAssignmentSyntax **)(local_1d0._M_p + 0x50);
                if ((((pPVar13 == (ParameterValueAssignmentSyntax *)0x0) ||
                     (*(long *)((long)_Var44._M_p + 0x50) == 0)) &&
                    ((bVar78 = (bool)local_1d0._M_p[0x10], bVar78 != true ||
                     (*(char *)((long)_Var44._M_p + 0x10) == '\0')))) &&
                   ((((string_view *)(local_1d0._M_p + 0x28))->_M_len == 0 ||
                    (*(long *)((long)_Var44._M_p + 0x20U + 8) == 0)))) {
                  if (pPVar13 != (ParameterValueAssignmentSyntax *)0x0) {
                    *(ParameterValueAssignmentSyntax **)((long)_Var44._M_p + 0x50) = pPVar13;
                  }
                  if (bVar78 != false) {
                    *(undefined8 *)((long)_Var44._M_p + 0x10) =
                         *(undefined8 *)(local_1d0._M_p + 0x10);
                    SVar27 = *(SourceLocation *)(local_1d0._M_p + 8);
                    ((Info *)_Var44._M_p)->rawTextPtr = *(char **)local_1d0._M_p;
                    ((Info *)_Var44._M_p)->location = SVar27;
                  }
                  if (((string_view *)(local_1d0._M_p + 0x28))->_M_len != 0) {
                    *(char *)((long)_Var44._M_p + 0x40U + 8) = local_1d0._M_p[0x48];
                    uVar61 = (((CellId *)(local_1d0._M_p + 0x18))->lib)._M_len;
                    pcVar5 = *(char **)(local_1d0._M_p + 0x20);
                    auVar98 = *(undefined1 (*) [16])
                               &((string_view *)(local_1d0._M_p + 0x28))->_M_len;
                    uVar28 = *(undefined8 *)&((SourceLocation *)(local_1d0._M_p + 0x40))->field_0x0;
                    ((Info *)((long)_Var44._M_p + 0x30))->location =
                         ((SourceRange *)(local_1d0._M_p + 0x38))->startLoc;
                    *(undefined8 *)((long)_Var44._M_p + 0x40) = uVar28;
                    *(undefined1 (*) [16])((long)_Var44._M_p + 0x20U + 8) = auVar98;
                    *(undefined8 *)((long)_Var44._M_p + 0x10U + 8) = uVar61;
                    *(char **)((long)_Var44._M_p + 0x20) = pcVar5;
                    pSVar40 = ((not_null<const_slang::syntax::SyntaxNode_*> *)
                              (local_1d0._M_p + 0x58))->ptr;
LAB_00450774:
                    *(SyntaxNode **)((long)_Var44._M_p + 0x50U + 8) = pSVar40;
                  }
                }
                else {
                  SVar111 = slang::syntax::SyntaxNode::sourceRange
                                      (((not_null<const_slang::syntax::SyntaxNode_*> *)
                                       (local_1d0._M_p + 0x58))->ptr);
                  pDVar43 = Scope::addDiag(pSVar33,(DiagCode)0xeb0006,SVar111);
                  local_1c8._M_value._M_ptr = (pointer)(local_140->name)._M_dataplus;
                  local_1c8._M_value._M_extent._M_extent_value =
                       (__extent_storage<18446744073709551615UL>)(local_140->name)._M_string_length;
                  local_1b8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                              local_2b8._M_str;
                  local_1b0._M_len = local_2b8._M_len;
                  fmt_00.size_ = 0xdd;
                  fmt_00.data_ = (char *)0xc;
                  args_01.field_1.args_ = aVar65.args_;
                  args_01.desc_ = (unsigned_long_long)&local_1c8;
                  ::fmt::v11::vformat_abi_cxx11_
                            ((string *)&local_2a8,(v11 *)"cell \'{}.{}\'",fmt_00,args_01);
                  pDVar43 = Diagnostic::operator<<(pDVar43,(string *)&local_2a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._M_len != &local_298) {
                    operator_delete((void *)local_2a8._M_len,local_298._M_allocated_capacity + 1);
                  }
                  SVar111 = slang::syntax::SyntaxNode::sourceRange
                                      (*(SyntaxNode **)((long)_Var44._M_p + 0x50U + 8));
                  Diagnostic::addNote(pDVar43,(DiagCode)0xa0001,SVar111);
                }
              }
            }
          }
        }
      }
      else if (iVar37 == 0xfd) {
        aVar66.values_ = (value<fmt::v11::context> *)((long)&ppVar55->second + 0x18);
        local_2b8 = parsing::Token::valueText((Token *)aVar66.values_);
        if (local_2b8._M_len != 0) {
          uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_f0,&local_2b8);
          ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                     *)(uVar38 >> ((byte)local_e8.groups_size_index & 0x3f));
          uVar11 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar38 & 0xff];
          auVar99._4_4_ = uVar11;
          auVar99._0_4_ = uVar11;
          auVar99._8_4_ = uVar11;
          auVar99._12_4_ = uVar11;
          local_280 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      local_e8.elements_;
          sVar18 = local_2b8._M_len;
          pcVar5 = local_2b8._M_str;
          uVar71 = (ulong)((uint)uVar38 & 7);
          local_228 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      local_e8.groups_size_mask;
          ppVar50 = (value_type_pointer)0x0;
          local_278 = local_e8.groups_;
          uVar61 = local_1e8._0_8_;
          do {
            aVar65 = local_280;
            pgVar41 = local_278 + (long)ptVar51;
            auVar82[0] = -(pgVar41->m[0].n == auVar99[0]);
            auVar82[1] = -(pgVar41->m[1].n == auVar99[1]);
            auVar82[2] = -(pgVar41->m[2].n == auVar99[2]);
            auVar82[3] = -(pgVar41->m[3].n == auVar99[3]);
            auVar82[4] = -(pgVar41->m[4].n == auVar99[4]);
            auVar82[5] = -(pgVar41->m[5].n == auVar99[5]);
            auVar82[6] = -(pgVar41->m[6].n == auVar99[6]);
            auVar82[7] = -(pgVar41->m[7].n == auVar99[7]);
            auVar82[8] = -(pgVar41->m[8].n == auVar99[8]);
            auVar82[9] = -(pgVar41->m[9].n == auVar99[9]);
            auVar82[10] = -(pgVar41->m[10].n == auVar99[10]);
            auVar82[0xb] = -(pgVar41->m[0xb].n == auVar99[0xb]);
            auVar82[0xc] = -(pgVar41->m[0xc].n == auVar99[0xc]);
            auVar82[0xd] = -(pgVar41->m[0xd].n == auVar99[0xd]);
            auVar82[0xe] = -(pgVar41->m[0xe].n == auVar99[0xe]);
            auVar82[0xf] = -(pgVar41->m[0xf].n == auVar99[0xf]);
            uVar53 = (uint)(ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe);
            local_250 = ptVar51;
            if (uVar53 != 0) {
              local_268._0_8_ = uVar71;
              local_288 = aVar66;
              local_248 = ppVar55;
              local_208 = auVar99;
              do {
                uVar22 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                ptVar56 = (try_emplace_args_t *)
                          ((long)aVar65.values_ + (ulong)uVar22 * 0x18 + (long)ptVar51 * 0x168);
                bVar78 = sVar18 == *(size_t *)ptVar56;
                if (bVar78 && sVar18 != 0) {
                  local_1e8._0_8_ = uVar61;
                  iVar37 = bcmp(pcVar5,*(void **)(ptVar56 + 8),sVar18);
                  bVar78 = iVar37 == 0;
                  uVar61 = local_1e8._0_8_;
                  uVar71 = local_268._0_8_;
                  aVar66 = local_288;
                  auVar99 = local_208;
                }
                ppVar55 = local_248;
                if (bVar78) goto LAB_004500c7;
                uVar53 = uVar53 - 1 & uVar53;
              } while (uVar53 != 0);
            }
            if ((local_278[(long)ptVar51].m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[uVar71]) == 0) break;
            ptVar51 = local_250 + (long)ppVar50;
            ppVar50 = (value_type_pointer)((long)&(ppVar50->first)._M_len + 1);
            ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                       *)((ulong)(ptVar51 + 1) & (ulong)local_228.values_);
          } while (ppVar50 <= local_228.values_);
          ptVar56 = (try_emplace_args_t *)0x0;
LAB_004500c7:
          pSVar33 = local_230;
          local_1e8._0_8_ = ptVar56;
          if (ptVar56 == (try_emplace_args_t *)0x0) {
            SVar111 = parsing::Token::range((Token *)aVar66.values_);
            Scope::addDiag(pSVar33,(DiagCode)0x1b0006,SVar111);
          }
          else {
            uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )local_270,&local_2b8);
            aVar66.values_ =
                 (value<fmt::v11::context> *)
                 (uVar38 >>
                 ((byte)(this->instanceOverrides).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                        .arrays.groups_size_index & 0x3f));
            pgVar41 = (this->instanceOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      .arrays.groups_;
            uVar11 = (&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word)[uVar38 & 0xff];
            auVar102._4_4_ = uVar11;
            auVar102._0_4_ = uVar11;
            auVar102._8_4_ = uVar11;
            auVar102._12_4_ = uVar11;
            ppVar50 = (this->instanceOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      .arrays.elements_;
            sVar18 = local_2b8._M_len;
            pcVar5 = local_2b8._M_str;
            local_268._0_8_ = uVar38;
            aVar65._0_4_ = (uint)uVar38 & 7;
            aVar65._4_4_ = 0;
            ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                       *)(this->instanceOverrides).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .arrays.groups_size_mask;
            ptVar69 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                       *)0x0;
            local_288.values_ = aVar66.values_;
            local_248 = ppVar55;
            do {
              pgVar62 = pgVar41 + (long)aVar66;
              auVar84[0] = -(pgVar62->m[0].n == auVar102[0]);
              auVar84[1] = -(pgVar62->m[1].n == auVar102[1]);
              auVar84[2] = -(pgVar62->m[2].n == auVar102[2]);
              auVar84[3] = -(pgVar62->m[3].n == auVar102[3]);
              auVar84[4] = -(pgVar62->m[4].n == auVar102[4]);
              auVar84[5] = -(pgVar62->m[5].n == auVar102[5]);
              auVar84[6] = -(pgVar62->m[6].n == auVar102[6]);
              auVar84[7] = -(pgVar62->m[7].n == auVar102[7]);
              auVar84[8] = -(pgVar62->m[8].n == auVar102[8]);
              auVar84[9] = -(pgVar62->m[9].n == auVar102[9]);
              auVar84[10] = -(pgVar62->m[10].n == auVar102[10]);
              auVar84[0xb] = -(pgVar62->m[0xb].n == auVar102[0xb]);
              auVar84[0xc] = -(pgVar62->m[0xc].n == auVar102[0xc]);
              auVar84[0xd] = -(pgVar62->m[0xd].n == auVar102[0xd]);
              auVar84[0xe] = -(pgVar62->m[0xe].n == auVar102[0xe]);
              auVar84[0xf] = -(pgVar62->m[0xf].n == auVar102[0xf]);
              aVar68 = aVar66;
              auVar81 = auVar102;
              aVar39 = local_228;
              auVar98 = local_208;
              ptVar70 = local_150;
              for (uVar53 = (uint)(ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe);
                  local_208 = auVar81, local_150 = ptVar69, local_228 = aVar68, uVar53 != 0;
                  uVar53 = uVar53 - 1 & uVar53) {
                uVar22 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                aVar68.values_ =
                     (value<fmt::v11::context> *)
                     (ppVar50 + (long)aVar66.values_ * 0xf + (ulong)uVar22);
                bVar78 = (pointer)sVar18 == (pointer)((aVar68.values_)->field_0).long_long_value;
                local_280 = aVar65;
                local_278 = pgVar41;
                local_250 = ptVar51;
                if (bVar78 && (pointer)sVar18 != (pointer)0x0) {
                  iVar37 = bcmp(pcVar5,*(Info **)((long)&(aVar68.values_)->field_0 + 8),sVar18);
                  bVar78 = iVar37 == 0;
                  auVar102 = local_208;
                }
                if (bVar78) goto LAB_004507e9;
                ptVar51 = local_250;
                aVar65 = local_280;
                aVar68 = local_228;
                pgVar41 = local_278;
                ptVar69 = local_150;
                auVar81 = local_208;
                aVar39 = local_228;
                auVar98 = local_208;
                ptVar70 = local_150;
              }
              local_208 = auVar98;
              if ((((group_type_pointer)((long)pgVar41 + (long)aVar66 * 0x10))->m[0xf].n &
                  (char)((Token *)((long)aVar65.values_ + 0x47ff50))->kind) == Unknown) break;
              ptVar69 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                         *)((long)local_150 + 1);
              aVar66.values_ =
                   (value<fmt::v11::context> *)
                   ((ulong)((long)local_150 + (long)((long)local_228.values_ + 1U)) & (ulong)ptVar51
                   );
              local_228 = aVar39;
              local_150 = ptVar70;
            } while (ptVar69 <= ptVar51);
            aVar68.values_ = (value<fmt::v11::context> *)0x0;
            local_228 = aVar39;
            local_150 = ptVar70;
LAB_004507e9:
            local_158 = aVar68;
            if ((value_type_pointer)aVar68.values_ == (value_type_pointer)0x0) {
              if ((this->instanceOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                  .size_ctrl.size <
                  (this->instanceOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((locator *)&local_1c8._M_value,
                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                            *)local_270,(arrays_type *)local_270,(size_t)local_288,local_268._0_8_,
                           (try_emplace_args_t *)&local_2a8,&local_2b8);
                psVar2 = &(this->instanceOverrides).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          .size_ctrl.size;
                *psVar2 = *psVar2 + 1;
                aVar68 = local_1b8;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((locator *)&local_1c8._M_value,
                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                            *)local_270,local_268._0_8_,(try_emplace_args_t *)&local_2a8,&local_2b8)
                ;
                aVar68 = local_1b8;
              }
            }
            pgVar14 = *(group_type_pointer *)
                       ((long)&local_248[1].second.childNodes.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               .arrays + 0x10);
            if (pgVar14 == (group_type_pointer)0x0) {
              uVar53 = 0;
            }
            else {
              plVar73 = *(long **)((long)&local_248[1].second.childNodes.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                          .arrays + 8);
              local_148 = plVar73 + (long)pgVar14;
              uVar53 = 0;
              local_268._0_8_ = aVar68.values_;
              do {
                local_2a8 = parsing::Token::valueText((Token *)(*plVar73 + 0x28));
                pgVar41 = (group_type_pointer)local_2a8._M_len;
                local_288._0_4_ = uVar53;
                uVar61 = local_268._0_8_;
                local_250 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                             *)(local_268._0_8_ + 0x10);
                local_228 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                            hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                            operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                        *)local_250,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &local_2a8);
                ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                           *)((ulong)local_228.values_ >> (*(byte *)(uVar61 + 0x10) & 0x3f));
                lVar47 = *(long *)(uVar61 + 0x20);
                uVar11 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word)[(ulong)local_228.values_ & 0xff];
                auVar103._4_4_ = uVar11;
                auVar103._0_4_ = uVar11;
                auVar103._8_4_ = uVar11;
                auVar103._12_4_ = uVar11;
                sVar18 = local_2a8._M_len;
                pcVar5 = local_2a8._M_str;
                local_280._0_4_ = local_228._0_4_ & 7;
                local_280._4_4_ = 0;
                uVar71 = 0;
                local_278 = pgVar41;
                local_150 = ptVar51;
                do {
                  pcVar6 = (char *)(lVar47 + (long)ptVar51 * 0x10);
                  auVar85[0] = -(*pcVar6 == auVar103[0]);
                  auVar85[1] = -(pcVar6[1] == auVar103[1]);
                  auVar85[2] = -(pcVar6[2] == auVar103[2]);
                  auVar85[3] = -(pcVar6[3] == auVar103[3]);
                  auVar85[4] = -(pcVar6[4] == auVar103[4]);
                  auVar85[5] = -(pcVar6[5] == auVar103[5]);
                  auVar85[6] = -(pcVar6[6] == auVar103[6]);
                  auVar85[7] = -(pcVar6[7] == auVar103[7]);
                  auVar85[8] = -(pcVar6[8] == auVar103[8]);
                  auVar85[9] = -(pcVar6[9] == auVar103[9]);
                  auVar85[10] = -(pcVar6[10] == auVar103[10]);
                  auVar85[0xb] = -(pcVar6[0xb] == auVar103[0xb]);
                  auVar85[0xc] = -(pcVar6[0xc] == auVar103[0xc]);
                  auVar85[0xd] = -(pcVar6[0xd] == auVar103[0xd]);
                  auVar85[0xe] = -(pcVar6[0xe] == auVar103[0xe]);
                  auVar85[0xf] = -(pcVar6[0xf] == auVar103[0xf]);
                  uVar53 = (uint)(ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe);
                  local_a8 = uVar71;
                  local_a0 = ptVar51;
                  if (uVar53 != 0) {
                    lVar15 = *(long *)(local_268._0_8_ + 0x28);
                    local_208 = auVar103;
                    local_b0 = lVar47;
                    do {
                      uVar22 = 0;
                      if (uVar53 != 0) {
                        for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      aVar68.values_ =
                           (value<fmt::v11::context> *)
                           (lVar15 + (long)ptVar51 * 0x438 + (ulong)uVar22 * 0x48);
                      bVar78 = (pointer)sVar18 ==
                               (pointer)((aVar68.values_)->field_0).long_long_value;
                      if (bVar78 && (pointer)sVar18 != (pointer)0x0) {
                        iVar37 = bcmp(pcVar5,*(Info **)((long)&(aVar68.values_)->field_0 + 8),sVar18
                                     );
                        bVar78 = iVar37 == 0;
                        auVar103 = local_208;
                      }
                      if (bVar78) goto LAB_00450a5a;
                      uVar53 = uVar53 - 1 & uVar53;
                      lVar47 = local_b0;
                    } while (uVar53 != 0);
                  }
                  if ((*(byte *)((long)ptVar51 * 0x10 + lVar47 + 0xf) &
                      (char)((Token *)(local_280.values_ + 0x47ff5))->kind) == Unknown) break;
                  uVar71 = local_a8 + 1;
                  ptVar51 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                             *)((ulong)(local_a0 + local_a8 + 1) &
                               *(ulong *)(local_268._0_8_ + 0x18));
                } while (uVar71 <= *(ulong *)(local_268._0_8_ + 0x18));
                aVar68.values_ = (value<fmt::v11::context> *)0x0;
LAB_00450a5a:
                aVar66 = local_288;
                local_1f0 = aVar68;
                if ((value_type_pointer)aVar68.values_ == (value_type_pointer)0x0) {
                  if (*(ulong *)(local_268._0_8_ + 0x38) < *(ulong *)(local_268._0_8_ + 0x30)) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                    ::
                    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                              ((locator *)&local_1c8._M_value,local_250,(arrays_type *)local_250,
                               (size_t)local_150,(size_t)local_228,(try_emplace_args_t *)&local_1d0,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_2a8);
                    *(long *)(local_268._0_8_ + 0x38) = *(long *)(local_268._0_8_ + 0x38) + 1;
                    aVar68 = local_1b8;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                              ((locator *)&local_1c8._M_value,local_250,(size_t)local_228,
                               (try_emplace_args_t *)&local_1d0,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_2a8);
                    aVar68 = local_1b8;
                  }
                }
                uVar53 = CONCAT31(aVar66._1_3_,aVar66._0_1_ | local_278 == (group_type_pointer)0x0);
                plVar73 = plVar73 + 1;
                local_268._0_8_ = aVar68.values_;
              } while (plVar73 != local_148);
            }
            if ((uVar53 & 1) == 0) {
              pCVar16 = *(ConfigLiblistSyntax **)
                         ((long)&local_248[1].second.childNodes.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                 .arrays + 0x18);
              local_170 = (pCVar16->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent;
              local_1b8.args_ = local_1b8.args_ & 0xffffffffffffff00;
              local_180._0_1_ = 0;
              local_190.startLoc = (SourceLocation)0x0;
              local_190.endLoc = (SourceLocation)0x0;
              local_1a0._M_len = 0;
              local_1a0._M_str = (char *)0x0;
              local_1b0._M_len = 0;
              local_1b0._M_str = (char *)0x0;
              local_178 = 0;
              local_168 = 0;
              if ((pCVar16->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind == ConfigUseClause)
              {
                local_178 = *(long *)&(pCVar16->libraries).super_SyntaxListBase.super_SyntaxNode;
                pp_Var17 = (pCVar16->libraries).super_SyntaxListBase._vptr_SyntaxListBase;
                if ((pp_Var17 != (_func_int **)0x0) &&
                   (sVar109 = parsing::Token::valueText((Token *)(pp_Var17 + 7)),
                   sVar109._M_len != 0)) {
                  local_1b0 = parsing::Token::valueText
                                        ((Token *)((pCVar16->libraries).super_SyntaxListBase.
                                                   _vptr_SyntaxListBase + 3));
                  local_1a0 = parsing::Token::valueText
                                        ((Token *)((pCVar16->libraries).super_SyntaxListBase.
                                                   _vptr_SyntaxListBase + 7));
                  local_190 = slang::syntax::SyntaxNode::sourceRange
                                        ((SyntaxNode *)
                                         (pCVar16->libraries).super_SyntaxListBase.
                                         _vptr_SyntaxListBase);
                  paVar42 = &local_180;
                  if ((pCVar16->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>
                      ._M_ptr != (pointer)0x0) goto LAB_00450c40;
                }
              }
              else {
                local_1c8._M_value =
                     (span<const_slang::SourceLibrary_*const,_18446744073709551615UL>)
                     resolve::anon_class_16_2_f7902cf0::operator()(&local_138,pCVar16);
                paVar42 = &local_1b8;
LAB_00450c40:
                *(undefined1 *)paVar42 = 1;
              }
              pSVar33 = local_230;
              _Var44._M_p = (((string *)(aVar68.values_ + 4))->_M_dataplus)._M_p;
              if ((Info *)_Var44._M_p == (Info *)0x0) {
                _Var44._M_p = (pointer)BumpAllocator::
                                       emplace<slang::ast::ConfigRule,slang::ast::ConfigRule&>
                                                 (&local_238->super_BumpAllocator,
                                                  (ConfigRule *)&local_1c8._M_value);
                (((string *)(aVar68.values_ + 4))->_M_dataplus)._M_p = _Var44._M_p;
              }
              else if ((((local_178 == 0) || (*(long *)((long)_Var44._M_p + 0x50) == 0)) &&
                       ((local_1b8._0_1_ != '\x01' || (*(char *)((long)_Var44._M_p + 0x10) == '\0'))
                       )) && ((local_1a0._M_len == 0 || (*(long *)((long)_Var44._M_p + 0x28) == 0)))
                      ) {
                if (local_178 != 0) {
                  *(long *)((long)_Var44._M_p + 0x50) = local_178;
                }
                if (local_1b8._0_1_ != '\0') {
                  *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   ((long)_Var44._M_p + 0x10) = (value<fmt::v11::context> *)local_1b8;
                  *(pointer *)_Var44._M_p = local_1c8._M_value._M_ptr;
                  *(__extent_storage<18446744073709551615UL> *)(_Var44._M_p + 8) =
                       local_1c8._M_value._M_extent._M_extent_value;
                }
                if (local_1a0._M_len != 0) {
                  ((SourceLocation *)(_Var44._M_p + 0x48))->field_0x0 = local_180._0_1_;
                  ((Info *)(_Var44._M_p + 0x30))->location = local_190.startLoc;
                  *(SourceLocation *)((long)_Var44._M_p + 0x40) = local_190.endLoc;
                  *(string_view *)((long)_Var44._M_p + 0x28) = local_1a0;
                  *(size_t *)(_Var44._M_p + 0x18) = local_1b0._M_len;
                  *(char **)((long)_Var44._M_p + 0x20) = local_1b0._M_str;
                  pSVar40 = local_170;
                  goto LAB_00450774;
                }
              }
              else {
                SVar111 = slang::syntax::SyntaxNode::sourceRange(local_170);
                pDVar43 = Scope::addDiag(pSVar33,(DiagCode)0xeb0006,SVar111);
                local_298._M_allocated_capacity = 0x65636e6174736e69;
                local_298._8_2_ = 0x2720;
                local_2a8._M_str = (char *)0xa;
                local_2a8._M_len = (size_t)&local_298;
                local_298._M_local_buf[10] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,local_2b8._M_str,local_2b8._M_len);
                pgVar14 = *(group_type_pointer *)
                           ((long)&local_248[1].second.childNodes.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                   .arrays + 0x10);
                if (pgVar14 != (group_type_pointer)0x0) {
                  sVar18 = *(size_t *)
                            ((long)&local_248[1].second.childNodes.table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                    .arrays + 8);
                  lVar47 = 0;
                  do {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_2a8,'.');
                    sVar109 = parsing::Token::valueText
                                        ((Token *)(*(long *)(sVar18 + lVar47) + 0x28));
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2a8,sVar109._M_str,sVar109._M_len);
                    lVar47 = lVar47 + 8;
                  } while ((long)pgVar14 << 3 != lVar47);
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2a8,'\'');
                pDVar43 = Diagnostic::operator<<
                                    (pDVar43,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_2a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_len != &local_298) {
                  operator_delete((void *)local_2a8._M_len,local_298._M_allocated_capacity + 1);
                }
                SVar111 = slang::syntax::SyntaxNode::sourceRange
                                    (*(SyntaxNode **)((long)_Var44._M_p + 0x58));
                Diagnostic::addNote(pDVar43,(DiagCode)0xa0001,SVar111);
              }
            }
          }
        }
      }
      else {
        sVar110 = resolve::anon_class_16_2_f7902cf0::operator()
                            (&local_138,
                             (ConfigLiblistSyntax *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)&ppVar55->second + 0x18))->_M_allocated_capacity);
        (this->defaultLiblist)._M_ptr = sVar110._M_ptr;
        (this->defaultLiblist)._M_extent =
             (__extent_storage<18446744073709551615UL>)sVar110._M_extent._M_extent_value;
      }
      pIVar58 = (Info *)&pIVar58->location;
    } while (pIVar58 != (Info *)(ppcVar32 + (long)_Var12._M_p));
  }
  local_288.values_ = (value<fmt::v11::context> *)&this->instanceOverrides;
  iVar112 = boost::unordered::detail::foa::
            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
            ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     *)local_288.values_);
  src = (ConfigBlockSymbol *)iVar112.p_;
  if (src != (ConfigBlockSymbol *)0x0) {
LAB_00450edb:
    ppVar52 = iVar112.p_;
    if ((ppVar52->second).rule != (ConfigRule *)0x0) {
      uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &local_f0,&ppVar52->first);
      uVar71 = uVar38 >> ((byte)local_e8.groups_size_index & 0x3f);
      uVar11 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[uVar38 & 0xff];
      auVar104._4_4_ = uVar11;
      auVar104._0_4_ = uVar11;
      auVar104._8_4_ = uVar11;
      auVar104._12_4_ = uVar11;
      ppVar55 = (value_type_pointer)0x0;
      pgVar41 = local_e8.groups_;
      aVar66 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_e8.elements_;
      aVar65 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               local_e8.groups_size_mask;
      do {
        pgVar62 = pgVar41 + uVar71;
        auVar86[0] = -(pgVar62->m[0].n == auVar104[0]);
        auVar86[1] = -(pgVar62->m[1].n == auVar104[1]);
        auVar86[2] = -(pgVar62->m[2].n == auVar104[2]);
        auVar86[3] = -(pgVar62->m[3].n == auVar104[3]);
        auVar86[4] = -(pgVar62->m[4].n == auVar104[4]);
        auVar86[5] = -(pgVar62->m[5].n == auVar104[5]);
        auVar86[6] = -(pgVar62->m[6].n == auVar104[6]);
        auVar86[7] = -(pgVar62->m[7].n == auVar104[7]);
        auVar86[8] = -(pgVar62->m[8].n == auVar104[8]);
        auVar86[9] = -(pgVar62->m[9].n == auVar104[9]);
        auVar86[10] = -(pgVar62->m[10].n == auVar104[10]);
        auVar86[0xb] = -(pgVar62->m[0xb].n == auVar104[0xb]);
        auVar86[0xc] = -(pgVar62->m[0xc].n == auVar104[0xc]);
        auVar86[0xd] = -(pgVar62->m[0xd].n == auVar104[0xd]);
        auVar86[0xe] = -(pgVar62->m[0xe].n == auVar104[0xe]);
        auVar86[0xf] = -(pgVar62->m[0xf].n == auVar104[0xf]);
        uVar53 = (uint)(ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe);
        uVar45 = uVar71;
        ppVar50 = ppVar55;
        if (uVar53 != 0) {
          local_268._0_8_ = pgVar41;
          local_208._0_8_ = uVar71;
          __n = (ppVar52->first)._M_len;
          local_218._0_8_ = (ppVar52->first)._M_str;
          local_270 = ppVar55;
          local_240 = aVar65;
          local_220 = aVar66;
          local_1e8 = auVar104;
          do {
            uVar22 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            ptVar56 = (try_emplace_args_t *)
                      ((long)aVar66.values_ + (ulong)uVar22 * 0x18 + uVar71 * 0x168);
            bVar78 = __n == *(size_t *)ptVar56;
            if (bVar78 && __n != 0) {
              iVar37 = bcmp((void *)local_218._0_8_,*(void **)(ptVar56 + 8),__n);
              bVar78 = iVar37 == 0;
              auVar104 = local_1e8;
            }
            if (bVar78) goto LAB_004510ca;
            uVar53 = uVar53 - 1 & uVar53;
          } while (uVar53 != 0);
          pgVar41 = (group_type_pointer)local_268._0_8_;
          uVar45 = local_208._0_8_;
          aVar66 = local_220;
          aVar65 = local_240;
          ppVar50 = local_270;
        }
        if ((pgVar41[uVar71].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar38 & 7]) == 0) break;
        ppVar55 = (value_type_pointer)((long)&(ppVar50->first)._M_len + 1);
        uVar71 = (ulong)((long)&(ppVar50->first)._M_len + uVar45 + 1) & (ulong)aVar65.values_;
      } while (ppVar55 <= aVar65.values_);
      ptVar56 = (try_emplace_args_t *)0x0;
LAB_004510ca:
      pSVar33 = local_230;
      pCVar19 = (ppVar52->second).rule;
      if ((pCVar19->useCell).name._M_len != 0) {
        SVar111 = slang::syntax::SyntaxNode::sourceRange((pCVar19->syntax).ptr);
        Scope::addDiag(pSVar33,(DiagCode)0x1c0006,SVar111);
      }
      (&((Symbol *)local_88._0_8_)->name)[*(long *)(ptVar56 + 0x10) * 2]._M_len =
           (size_t)(ppVar52->second).rule;
      src = (ConfigBlockSymbol *)local_88._0_8_;
    }
    puVar48 = iVar112.pc_ + 2;
    do {
      puVar74 = puVar48;
      puVar48 = iVar112.pc_;
      ppVar52 = iVar112.p_ + 1;
      if (((uint)iVar112.pc_ & 0xf) == 0xe) goto LAB_0045111c;
      puVar9 = puVar74 + -1;
      iVar112.p_ = ppVar52;
      iVar112.pc_ = puVar48 + 1;
      puVar48 = puVar74 + 1;
    } while (*puVar9 == '\0');
    puVar74 = puVar74 + -1;
    if (*puVar9 == '\x01') {
      ppVar52 = (table_element_pointer)0x0;
    }
    goto LAB_00450f18;
  }
LAB_00451176:
  if ((Compilation *)local_88._8_8_ != (Compilation *)0x0) {
    ppVar55 = (value_type_pointer)(&((Symbol *)local_88._0_8_)->kind + local_88._8_8_ * 8);
    pCVar59 = (ConfigBlockSymbol *)local_88._0_8_;
    local_270 = ppVar55;
    do {
      if ((pCVar59->super_Symbol).name._M_len == 0) {
        local_220.values_ = *(value<fmt::v11::context> **)&pCVar59->super_Symbol;
        uVar38 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &this->cellOverrides,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            &((basic_string_view<char,_std::char_traits<char>_> *)
                             &(local_220.args_)->value_)->_M_str);
        auVar98 = local_268;
        pgVar62 = (group_type_pointer)
                  (uVar38 >>
                  ((byte)(this->cellOverrides).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                         .arrays.groups_size_index & 0x3f));
        pgVar41 = (this->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .arrays.groups_;
        uVar11 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar38 & 0xff];
        auVar105._4_4_ = uVar11;
        auVar105._0_4_ = uVar11;
        auVar105._8_4_ = uVar11;
        auVar105._12_4_ = uVar11;
        local_240 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                    (this->cellOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                    .arrays.elements_;
        local_268._4_4_ = 0;
        local_268._0_4_ = (uint)uVar38 & 7;
        local_268._8_8_ = auVar98._8_8_;
        local_280 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                    (this->cellOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                    .arrays.groups_size_mask;
        ppVar50 = (value_type_pointer)0x0;
        src = this;
        do {
          aVar66 = local_240;
          local_208._0_8_ = ppVar50;
          pgVar7 = pgVar41 + (long)pgVar62;
          auVar88[0] = -(pgVar7->m[0].n == auVar105[0]);
          auVar88[1] = -(pgVar7->m[1].n == auVar105[1]);
          auVar88[2] = -(pgVar7->m[2].n == auVar105[2]);
          auVar88[3] = -(pgVar7->m[3].n == auVar105[3]);
          auVar88[4] = -(pgVar7->m[4].n == auVar105[4]);
          auVar88[5] = -(pgVar7->m[5].n == auVar105[5]);
          auVar88[6] = -(pgVar7->m[6].n == auVar105[6]);
          auVar88[7] = -(pgVar7->m[7].n == auVar105[7]);
          auVar88[8] = -(pgVar7->m[8].n == auVar105[8]);
          auVar88[9] = -(pgVar7->m[9].n == auVar105[9]);
          auVar88[10] = -(pgVar7->m[10].n == auVar105[10]);
          auVar88[0xb] = -(pgVar7->m[0xb].n == auVar105[0xb]);
          auVar88[0xc] = -(pgVar7->m[0xc].n == auVar105[0xc]);
          auVar88[0xd] = -(pgVar7->m[0xd].n == auVar105[0xd]);
          auVar88[0xe] = -(pgVar7->m[0xe].n == auVar105[0xe]);
          auVar88[0xf] = -(pgVar7->m[0xf].n == auVar105[0xf]);
          uVar53 = (uint)(ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe);
          ppVar50 = (value_type_pointer)((long)pgVar62 * 0x10);
          local_278 = pgVar62;
          if (uVar53 != 0) {
            pIVar58 = *(Info **)((long)&(local_220.values_)->field_0 + 8);
            __s1 = (void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(local_220.args_)->type_)->_M_allocated_capacity;
            local_248 = (value_type_pointer)((long)pgVar62 * 0x10);
            local_218 = auVar105;
            do {
              uVar22 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              ptVar56 = (try_emplace_args_t *)
                        ((long)aVar66.values_ + (ulong)uVar22 * 0x48 + (long)pgVar62 * 0x438);
              bVar78 = pIVar58 == *(Info **)ptVar56;
              src = (ConfigBlockSymbol *)
                    CONCAT71((int7)((ulong)src >> 8),!bVar78 || pIVar58 == (Info *)0x0);
              if (bVar78 && pIVar58 != (Info *)0x0) {
                iVar37 = bcmp(__s1,*(void **)(ptVar56 + 8),(size_t)pIVar58);
                bVar78 = iVar37 == 0;
                src = extraout_RDX;
                auVar105 = local_218;
              }
              ppVar55 = local_270;
              if (bVar78) goto LAB_0045137f;
              uVar53 = uVar53 - 1 & uVar53;
              ppVar50 = local_248;
            } while (uVar53 != 0);
          }
          src = (ConfigBlockSymbol *)(pgVar41->m + (long)&ppVar50->first);
          if ((*(byte *)((long)&(src->super_Symbol).name._M_len + 7) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[local_268._0_8_]) == 0) break;
          ppVar50 = (value_type_pointer)(local_208._0_8_ + 1);
          pgVar62 = (group_type_pointer)
                    ((ulong)(local_278->m + local_208._0_8_ + 1) & (ulong)local_280.values_);
        } while (ppVar50 <= local_280.values_);
        ptVar56 = (try_emplace_args_t *)0x0;
LAB_0045137f:
        pSVar33 = local_230;
        if (ptVar56 != (try_emplace_args_t *)0x0) {
          (pCVar59->super_Symbol).name._M_len = *(size_t *)(ptVar56 + 0x40);
          uVar71 = *(ulong *)(*(long *)&pCVar59->super_Symbol + 0x2d0);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar71;
          uVar67 = SUB168(auVar24 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar24 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar45 = uVar67 >> ((byte)ptVar56[0x10] & 0x3f);
          uVar11 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar67 & 0xff];
          src = (ConfigBlockSymbol *)(ulong)((uint)uVar67 & 7);
          uVar67 = 0;
          do {
            pcVar5 = (char *)(*(long *)(ptVar56 + 0x20) + uVar45 * 0x10);
            cVar79 = (char)uVar11;
            auVar106[0] = -(*pcVar5 == cVar79);
            cVar92 = (char)((uint)uVar11 >> 8);
            auVar106[1] = -(pcVar5[1] == cVar92);
            cVar94 = (char)((uint)uVar11 >> 0x10);
            auVar106[2] = -(pcVar5[2] == cVar94);
            cVar96 = (char)((uint)uVar11 >> 0x18);
            auVar106[3] = -(pcVar5[3] == cVar96);
            auVar106[4] = -(pcVar5[4] == cVar79);
            auVar106[5] = -(pcVar5[5] == cVar92);
            auVar106[6] = -(pcVar5[6] == cVar94);
            auVar106[7] = -(pcVar5[7] == cVar96);
            auVar106[8] = -(pcVar5[8] == cVar79);
            auVar106[9] = -(pcVar5[9] == cVar92);
            auVar106[10] = -(pcVar5[10] == cVar94);
            auVar106[0xb] = -(pcVar5[0xb] == cVar96);
            auVar106[0xc] = -(pcVar5[0xc] == cVar79);
            auVar106[0xd] = -(pcVar5[0xd] == cVar92);
            auVar106[0xe] = -(pcVar5[0xe] == cVar94);
            auVar106[0xf] = -(pcVar5[0xf] == cVar96);
            uVar53 = (uint)(ushort)((ushort)(SUB161(auVar106 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar106 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar106 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar106 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar106 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar106 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar106 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar106 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar106 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar106 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar106 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar106 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar106 >> 0x77,0) & 1) << 0xe);
            if (uVar53 != 0) {
              do {
                iVar37 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
                  }
                }
                if (uVar71 == *(ulong *)(*(long *)(ptVar56 + 0x28) +
                                        (ulong)(uint)(iVar37 << 4) + uVar45 * 0xf0)) {
                  local_1e8._0_8_ =
                       *(long *)(ptVar56 + 0x28) + (ulong)(uint)(iVar37 << 4) + uVar45 * 0xf0;
                  goto LAB_00451478;
                }
                uVar53 = uVar53 - 1 & uVar53;
              } while (uVar53 != 0);
            }
            if ((*(byte *)(*(long *)(ptVar56 + 0x20) + 0xf + uVar45 * 0x10) &
                *(byte *)&src[0x3b13].super_Symbol.nextInScope) == 0) break;
            lVar47 = uVar45 + uVar67;
            uVar67 = uVar67 + 1;
            uVar45 = lVar47 + 1U & *(ulong *)(ptVar56 + 0x18);
          } while (uVar67 <= *(ulong *)(ptVar56 + 0x18));
          local_1e8._0_8_ = 0;
LAB_00451478:
          if (local_1e8._0_8_ != 0) {
            (pCVar59->super_Symbol).name._M_len = *(size_t *)(local_1e8._0_8_ + 8);
          }
          sVar18 = (pCVar59->super_Symbol).name._M_len;
          if ((sVar18 != 0) && (*(long *)(sVar18 + 0x28) != 0)) {
            SVar111 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(sVar18 + 0x58));
            Scope::addDiag(pSVar33,(DiagCode)0x1c0006,SVar111);
            src = extraout_RDX_00;
          }
        }
      }
      pCVar59 = (ConfigBlockSymbol *)&(pCVar59->super_Symbol).parentScope;
    } while (pCVar59 != (ConfigBlockSymbol *)ppVar55);
  }
  iVar37 = SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::copy
                     ((SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *)local_88,
                      (EVP_PKEY_CTX *)local_238,(EVP_PKEY_CTX *)src);
  (this->topCells)._M_ptr = (pointer)CONCAT44(extraout_var,iVar37);
  (this->topCells)._M_extent._M_extent_value = extraout_RDX_01;
  iVar113 = boost::unordered::detail::foa::
            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
            ::begin(&(this->cellOverrides).table_);
  if (iVar113.p_ != (table_element_pointer)0x0) {
    local_218._0_8_ = &this->ruleBySyntax;
LAB_00451527:
    ppVar57 = iVar113.p_;
    local_208._0_8_ = iVar113.pc_;
    pCVar19 = (ppVar57->second).defaultRule;
    if (pCVar19 != (ConfigRule *)0x0) {
      pSVar40 = (pCVar19->syntax).ptr;
      local_2a8._M_len = (size_t)pSVar40;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = pSVar40;
      uVar67 = SUB168(auVar25 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar25 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar45 = uVar67 >> ((byte)(this->ruleBySyntax).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar20 = (this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .arrays.groups_;
      uVar11 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[uVar67 & 0xff];
      ppVar21 = (this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .arrays.elements_;
      local_238 = (Compilation *)
                  (this->ruleBySyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                  .arrays.groups_size_mask;
      pCVar77 = (Compilation *)0x0;
      uVar71 = uVar45;
      do {
        pgVar8 = pgVar20 + uVar71;
        uVar80 = (uchar)uVar11;
        auVar107[0] = -(pgVar8->m[0].n == uVar80);
        uVar93 = (uchar)((uint)uVar11 >> 8);
        auVar107[1] = -(pgVar8->m[1].n == uVar93);
        uVar95 = (uchar)((uint)uVar11 >> 0x10);
        auVar107[2] = -(pgVar8->m[2].n == uVar95);
        uVar97 = (uchar)((uint)uVar11 >> 0x18);
        auVar107[3] = -(pgVar8->m[3].n == uVar97);
        auVar107[4] = -(pgVar8->m[4].n == uVar80);
        auVar107[5] = -(pgVar8->m[5].n == uVar93);
        auVar107[6] = -(pgVar8->m[6].n == uVar95);
        auVar107[7] = -(pgVar8->m[7].n == uVar97);
        auVar107[8] = -(pgVar8->m[8].n == uVar80);
        auVar107[9] = -(pgVar8->m[9].n == uVar93);
        auVar107[10] = -(pgVar8->m[10].n == uVar95);
        auVar107[0xb] = -(pgVar8->m[0xb].n == uVar97);
        auVar107[0xc] = -(pgVar8->m[0xc].n == uVar80);
        auVar107[0xd] = -(pgVar8->m[0xd].n == uVar93);
        auVar107[0xe] = -(pgVar8->m[0xe].n == uVar95);
        auVar107[0xf] = -(pgVar8->m[0xf].n == uVar97);
        for (uVar53 = (uint)(ushort)((ushort)(SUB161(auVar107 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar107 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar107 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar107 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar107 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar107 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar107 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar107 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar107 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar107 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar107 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar107 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar107 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar107 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar107 >> 0x77,0) & 1) << 0xe); uVar53 != 0;
            uVar53 = uVar53 - 1 & uVar53) {
          iVar37 = 0;
          if (uVar53 != 0) {
            for (; (uVar53 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
            }
          }
          if (pSVar40 ==
              *(SyntaxNode **)((long)&ppVar21[uVar71 * 0xf].first + (ulong)(uint)(iVar37 << 4))) {
            aVar66.values_ =
                 (value<fmt::v11::context> *)
                 ((long)&ppVar21[uVar71 * 0xf].first + (ulong)(uint)(iVar37 << 4));
            goto LAB_00451665;
          }
        }
        if ((pgVar20[uVar71].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar67 & 7]) == 0) {
          aVar66.values_ = (value<fmt::v11::context> *)0x0;
          goto LAB_00451665;
        }
        pBVar31 = &pCVar77->super_BumpAllocator;
        pCVar77 = (Compilation *)((long)&(pCVar77->super_BumpAllocator).head + 1);
        uVar71 = (long)&pBVar31->head + uVar71 + 1 & (ulong)local_238;
      } while (pCVar77 <= local_238);
      aVar66.values_ = (value<fmt::v11::context> *)0x0;
LAB_00451665:
      if ((value_type_pointer)aVar66.values_ == (value_type_pointer)0x0) {
        if ((this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.size <
            (this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_1c8._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)local_218._0_8_,(arrays_type *)local_218._0_8_,uVar45,uVar67,
                     (try_emplace_args_t *)&local_2b8,(SyntaxNode **)&local_2a8);
          psVar2 = &(this->ruleBySyntax).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                    .size_ctrl.size;
          *psVar2 = *psVar2 + 1;
          aVar66 = local_1b8;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_1c8._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)local_218._0_8_,uVar67,(try_emplace_args_t *)&local_2b8,
                     (SyntaxNode **)&local_2a8);
          aVar66 = local_1b8;
        }
      }
      *(ConfigRule **)((long)&(aVar66.values_)->field_0 + 8) = pCVar19;
    }
    local_268._0_8_ = ppVar57;
    iVar114 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
              ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                       *)&ppVar57->second);
    if (iVar114.p_ != (table_element_pointer_conflict)0x0) {
LAB_004516ec:
      pCVar19 = (iVar114.p_)->second;
      pSVar40 = (pCVar19->syntax).ptr;
      local_2a8._M_len = (size_t)pSVar40;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = pSVar40;
      uVar67 = SUB168(auVar26 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar26 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar45 = uVar67 >> ((byte)(this->ruleBySyntax).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar20 = (this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .arrays.groups_;
      uVar11 = (&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                 word)[uVar67 & 0xff];
      ppVar21 = (this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .arrays.elements_;
      pCVar77 = (Compilation *)
                (this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .arrays.groups_size_mask;
      local_1e8._0_8_ = pCVar77;
      pCVar72 = (Compilation *)0x0;
      uVar71 = uVar45;
      do {
        local_238 = pCVar72;
        pgVar8 = pgVar20 + uVar71;
        uVar80 = (uchar)uVar11;
        auVar108[0] = -(pgVar8->m[0].n == uVar80);
        uVar93 = (uchar)((uint)uVar11 >> 8);
        auVar108[1] = -(pgVar8->m[1].n == uVar93);
        uVar95 = (uchar)((uint)uVar11 >> 0x10);
        auVar108[2] = -(pgVar8->m[2].n == uVar95);
        uVar97 = (uchar)((uint)uVar11 >> 0x18);
        auVar108[3] = -(pgVar8->m[3].n == uVar97);
        auVar108[4] = -(pgVar8->m[4].n == uVar80);
        auVar108[5] = -(pgVar8->m[5].n == uVar93);
        auVar108[6] = -(pgVar8->m[6].n == uVar95);
        auVar108[7] = -(pgVar8->m[7].n == uVar97);
        auVar108[8] = -(pgVar8->m[8].n == uVar80);
        auVar108[9] = -(pgVar8->m[9].n == uVar93);
        auVar108[10] = -(pgVar8->m[10].n == uVar95);
        auVar108[0xb] = -(pgVar8->m[0xb].n == uVar97);
        auVar108[0xc] = -(pgVar8->m[0xc].n == uVar80);
        auVar108[0xd] = -(pgVar8->m[0xd].n == uVar93);
        auVar108[0xe] = -(pgVar8->m[0xe].n == uVar95);
        auVar108[0xf] = -(pgVar8->m[0xf].n == uVar97);
        for (uVar53 = (uint)(ushort)((ushort)(SUB161(auVar108 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar108 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar108 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar108 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar108 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar108 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar108 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar108 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar108 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar108 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar108 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar108 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar108 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar108 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar108 >> 0x77,0) & 1) << 0xe); uVar53 != 0;
            uVar53 = uVar53 - 1 & uVar53) {
          iVar37 = 0;
          if (uVar53 != 0) {
            for (; (uVar53 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
            }
          }
          if (pSVar40 ==
              *(SyntaxNode **)((long)&ppVar21[uVar71 * 0xf].first + (ulong)(uint)(iVar37 << 4))) {
            aVar66.values_ =
                 (value<fmt::v11::context> *)
                 ((long)&ppVar21[uVar71 * 0xf].first + (ulong)(uint)(iVar37 << 4));
            goto LAB_00451809;
          }
        }
        if ((pgVar20[uVar71].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar67 & 7]) == 0) break;
        pCVar72 = (Compilation *)((long)&(local_238->super_BumpAllocator).head + 1);
        uVar71 = (long)&(local_238->super_BumpAllocator).head + uVar71 + 1 & (ulong)pCVar77;
      } while (pCVar72 <= pCVar77);
      aVar66.values_ = (value<fmt::v11::context> *)0x0;
LAB_00451809:
      if ((value_type_pointer)aVar66.values_ == (value_type_pointer)0x0) {
        if ((this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.size <
            (this->ruleBySyntax).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_1c8._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)local_218._0_8_,(arrays_type *)local_218._0_8_,uVar45,uVar67,
                     (try_emplace_args_t *)&local_2b8,(SyntaxNode **)&local_2a8);
          psVar2 = &(this->ruleBySyntax).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                    .size_ctrl.size;
          *psVar2 = *psVar2 + 1;
          aVar66 = local_1b8;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                    ((locator *)&local_1c8._M_value,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                      *)local_218._0_8_,uVar67,(try_emplace_args_t *)&local_2b8,
                     (SyntaxNode **)&local_2a8);
          aVar66 = local_1b8;
        }
      }
      *(ConfigRule **)((long)&(aVar66.values_)->field_0 + 8) = pCVar19;
      puVar46 = iVar114.pc_ + 2;
      do {
        puVar75 = puVar46;
        puVar46 = iVar114.pc_;
        ppVar60 = iVar114.p_ + 1;
        if (((uint)iVar114.pc_ & 0xf) == 0xe) goto LAB_004518b0;
        puVar10 = puVar75 + -1;
        iVar114.p_ = ppVar60;
        iVar114.pc_ = puVar46 + 1;
        puVar46 = puVar75 + 1;
      } while (*puVar10 == '\0');
      puVar75 = puVar75 + -1;
      if (*puVar10 == '\x01') {
        ppVar60 = (table_element_pointer_conflict)0x0;
      }
      goto LAB_0045189e;
    }
LAB_0045192c:
    lVar47 = local_208._0_8_;
    ppVar57 = (table_element_pointer)local_268._0_8_;
    puVar35 = (char_pointer)(local_208._0_8_ + 2);
    do {
      puVar63 = puVar35;
      ppVar57 = ppVar57 + 1;
      if (((uint)lVar47 & 0xf) == 0xe) goto LAB_00451977;
      puVar1 = puVar63 + -1;
      lVar47 = lVar47 + 1;
      puVar35 = puVar63 + 1;
    } while (*puVar1 == '\0');
    puVar63 = puVar63 + -1;
    if (*puVar1 == '\x01') {
      ppVar57 = (table_element_pointer)0x0;
    }
    goto LAB_00451968;
  }
LAB_004519f2:
  if (this->resolved == false) {
    resolve(this);
  }
  iVar115 = boost::unordered::detail::foa::
            table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
            ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     *)local_288);
  ppVar52 = iVar115.p_;
joined_r0x00451a17:
  if (ppVar52 == (table_element_pointer)0x0) {
    if ((ConfigBlockSymbol *)local_88._0_8_ != (ConfigBlockSymbol *)(local_88 + 0x18)) {
      operator_delete((void *)local_88._0_8_);
    }
    local_1c8._M_value._M_ptr = (pointer)local_f0;
    if ((value_type_pointer)local_e8.elements_ != (value_type_pointer)0x0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>
                    *)&local_1c8._M_value,local_e8.elements_,
                   (local_e8.groups_size_mask * 0x178 + 0x186) / 0x18);
    }
    return;
  }
  registerRules(this,&(iVar115.p_)->second);
  puVar48 = iVar115.pc_ + 2;
  do {
    puVar74 = puVar48;
    puVar48 = iVar115.pc_;
    ppVar52 = iVar115.p_ + 1;
    if (((uint)iVar115.pc_ & 0xf) == 0xe) goto LAB_00451a6f;
    puVar9 = puVar74 + -1;
    iVar115.p_ = ppVar52;
    iVar115.pc_ = puVar48 + 1;
    puVar48 = puVar74 + 1;
  } while (*puVar9 == '\0');
  puVar74 = puVar74 + -1;
  if (*puVar9 == '\x01') {
    ppVar52 = (table_element_pointer)0x0;
  }
  goto LAB_00451a63;
LAB_0045111c:
  do {
    auVar87[0] = -(*puVar74 == '\0');
    auVar87[1] = -(puVar74[1] == '\0');
    auVar87[2] = -(puVar74[2] == '\0');
    auVar87[3] = -(puVar74[3] == '\0');
    auVar87[4] = -(puVar74[4] == '\0');
    auVar87[5] = -(puVar74[5] == '\0');
    auVar87[6] = -(puVar74[6] == '\0');
    auVar87[7] = -(puVar74[7] == '\0');
    auVar87[8] = -(puVar74[8] == '\0');
    auVar87[9] = -(puVar74[9] == '\0');
    auVar87[10] = -(puVar74[10] == '\0');
    auVar87[0xb] = -(puVar74[0xb] == '\0');
    auVar87[0xc] = -(puVar74[0xc] == '\0');
    auVar87[0xd] = -(puVar74[0xd] == '\0');
    auVar87[0xe] = -(puVar74[0xe] == '\0');
    auVar87[0xf] = -(puVar74[0xf] == '\0');
    uVar53 = (uint)(ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe);
    if (uVar53 == 0x7fff) {
      puVar74 = puVar74 + 0x10;
      ppVar52 = ppVar52 + 0xf;
    }
    else {
      uVar22 = 0;
      if ((uVar53 ^ 0x7fff) != 0) {
        for (; ((uVar53 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      if (puVar74[uVar22] == '\x01') {
        ppVar52 = (table_element_pointer)0x0;
      }
      else {
        puVar74 = puVar74 + uVar22;
        ppVar52 = ppVar52 + uVar22;
      }
    }
  } while (uVar53 == 0x7fff);
LAB_00450f18:
  iVar112.p_ = ppVar52;
  iVar112.pc_ = puVar74;
  if (ppVar52 == (table_element_pointer)0x0) goto LAB_00451176;
  goto LAB_00450edb;
LAB_004518b0:
  do {
    auVar89[0] = -(*puVar75 == '\0');
    auVar89[1] = -(puVar75[1] == '\0');
    auVar89[2] = -(puVar75[2] == '\0');
    auVar89[3] = -(puVar75[3] == '\0');
    auVar89[4] = -(puVar75[4] == '\0');
    auVar89[5] = -(puVar75[5] == '\0');
    auVar89[6] = -(puVar75[6] == '\0');
    auVar89[7] = -(puVar75[7] == '\0');
    auVar89[8] = -(puVar75[8] == '\0');
    auVar89[9] = -(puVar75[9] == '\0');
    auVar89[10] = -(puVar75[10] == '\0');
    auVar89[0xb] = -(puVar75[0xb] == '\0');
    auVar89[0xc] = -(puVar75[0xc] == '\0');
    auVar89[0xd] = -(puVar75[0xd] == '\0');
    auVar89[0xe] = -(puVar75[0xe] == '\0');
    auVar89[0xf] = -(puVar75[0xf] == '\0');
    uVar53 = (uint)(ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe);
    if (uVar53 == 0x7fff) {
      puVar75 = puVar75 + 0x10;
      ppVar60 = ppVar60 + 0xf;
    }
    else {
      uVar22 = 0;
      if ((uVar53 ^ 0x7fff) != 0) {
        for (; ((uVar53 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      if (puVar75[uVar22] == '\x01') {
        ppVar60 = (table_element_pointer_conflict)0x0;
      }
      else {
        puVar75 = puVar75 + uVar22;
        ppVar60 = (table_element_pointer_conflict)((long)&ppVar60->first + (ulong)(uVar22 << 4));
      }
    }
  } while (uVar53 == 0x7fff);
LAB_0045189e:
  iVar114.p_ = ppVar60;
  iVar114.pc_ = puVar75;
  if (ppVar60 == (table_element_pointer_conflict)0x0) goto LAB_0045192c;
  goto LAB_004516ec;
LAB_00451977:
  do {
    auVar90[0] = -(*puVar63 == '\0');
    auVar90[1] = -(puVar63[1] == '\0');
    auVar90[2] = -(puVar63[2] == '\0');
    auVar90[3] = -(puVar63[3] == '\0');
    auVar90[4] = -(puVar63[4] == '\0');
    auVar90[5] = -(puVar63[5] == '\0');
    auVar90[6] = -(puVar63[6] == '\0');
    auVar90[7] = -(puVar63[7] == '\0');
    auVar90[8] = -(puVar63[8] == '\0');
    auVar90[9] = -(puVar63[9] == '\0');
    auVar90[10] = -(puVar63[10] == '\0');
    auVar90[0xb] = -(puVar63[0xb] == '\0');
    auVar90[0xc] = -(puVar63[0xc] == '\0');
    auVar90[0xd] = -(puVar63[0xd] == '\0');
    auVar90[0xe] = -(puVar63[0xe] == '\0');
    auVar90[0xf] = -(puVar63[0xf] == '\0');
    uVar53 = (uint)(ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe);
    if (uVar53 == 0x7fff) {
      puVar63 = puVar63 + 0x10;
      ppVar57 = ppVar57 + 0xf;
    }
    else {
      uVar22 = 0;
      if ((uVar53 ^ 0x7fff) != 0) {
        for (; ((uVar53 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      if (puVar63[uVar22] == '\x01') {
        ppVar57 = (table_element_pointer)0x0;
      }
      else {
        puVar63 = puVar63 + uVar22;
        ppVar57 = ppVar57 + uVar22;
      }
    }
  } while (uVar53 == 0x7fff);
LAB_00451968:
  iVar113.p_ = ppVar57;
  iVar113.pc_ = puVar63;
  if (ppVar57 == (table_element_pointer)0x0) goto LAB_004519f2;
  goto LAB_00451527;
LAB_00451a6f:
  do {
    auVar91[0] = -(*puVar74 == '\0');
    auVar91[1] = -(puVar74[1] == '\0');
    auVar91[2] = -(puVar74[2] == '\0');
    auVar91[3] = -(puVar74[3] == '\0');
    auVar91[4] = -(puVar74[4] == '\0');
    auVar91[5] = -(puVar74[5] == '\0');
    auVar91[6] = -(puVar74[6] == '\0');
    auVar91[7] = -(puVar74[7] == '\0');
    auVar91[8] = -(puVar74[8] == '\0');
    auVar91[9] = -(puVar74[9] == '\0');
    auVar91[10] = -(puVar74[10] == '\0');
    auVar91[0xb] = -(puVar74[0xb] == '\0');
    auVar91[0xc] = -(puVar74[0xc] == '\0');
    auVar91[0xd] = -(puVar74[0xd] == '\0');
    auVar91[0xe] = -(puVar74[0xe] == '\0');
    auVar91[0xf] = -(puVar74[0xf] == '\0');
    uVar53 = (uint)(ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe);
    if (uVar53 == 0x7fff) {
      puVar74 = puVar74 + 0x10;
      ppVar52 = ppVar52 + 0xf;
    }
    else {
      uVar22 = 0;
      if ((uVar53 ^ 0x7fff) != 0) {
        for (; ((uVar53 ^ 0x7fff) >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      if (puVar74[uVar22] == '\x01') {
        ppVar52 = (table_element_pointer)0x0;
      }
      else {
        puVar74 = puVar74 + uVar22;
        ppVar52 = ppVar52 + uVar22;
      }
    }
  } while (uVar53 == 0x7fff);
LAB_00451a63:
  iVar115.p_ = ppVar52;
  iVar115.pc_ = puVar74;
  goto joined_r0x00451a17;
}

Assistant:

void ConfigBlockSymbol::resolve() const {
    SLANG_ASSERT(!resolved);
    resolved = true;

    auto scope = getParentScope();
    SLANG_ASSERT(getSyntax() && scope);

    auto& comp = scope->getCompilation();
    auto& syntax = getSyntax()->as<ConfigDeclarationSyntax>();

    SmallMap<std::string_view, size_t, 2> topCellNames;
    SmallVector<TopCell> topCellsBuf;
    for (auto cellId : syntax.topCells) {
        auto cellName = cellId->cell.valueText();
        if (!cellName.empty()) {
            auto def = comp.getDefinition(*this, cellName, cellId->library.valueText(),
                                          cellId->sourceRange());
            if (!def)
                continue;

            auto [it, inserted] = topCellNames.emplace(cellName, topCellsBuf.size());
            if (inserted)
                topCellsBuf.emplace_back(*def, cellId->sourceRange());
            else
                scope->addDiag(diag::ConfigDupTop, cellId->cell.range()) << cellName;
        }
    }

    auto buildLiblist = [&](const ConfigLiblistSyntax& cll) {
        SmallVector<const SourceLibrary*> buf;
        for (auto token : cll.libraries) {
            if (auto name = token.valueText(); !name.empty()) {
                if (auto lib = comp.getSourceLibrary(name))
                    buf.push_back(lib);
                else
                    scope->addDiag(diag::WarnUnknownLibrary, token.range()) << name;
            }
        }
        return buf.copy(comp);
    };

    auto buildRule = [&](const ConfigRuleClauseSyntax& rule) {
        ConfigRule result(*rule.parent);
        if (rule.kind == SyntaxKind::ConfigUseClause) {
            auto& cuc = rule.as<ConfigUseClauseSyntax>();
            result.paramOverrides = cuc.paramAssignments;
            if (cuc.name && !cuc.name->cell.valueText().empty()) {
                result.useCell.lib = cuc.name->library.valueText();
                result.useCell.name = cuc.name->cell.valueText();
                result.useCell.sourceRange = cuc.name->sourceRange();
                if (cuc.config)
                    result.useCell.targetConfig = true;
            }
        }
        else {
            result.liblist = buildLiblist(rule.as<ConfigLiblistSyntax>());
        }
        return result;
    };

    auto mergeRules = [&](ConfigRule& curRule, const ConfigRule& newRule, auto&& nameGetter) {
        if ((bool(newRule.paramOverrides) && bool(curRule.paramOverrides)) ||
            (newRule.liblist.has_value() && curRule.liblist.has_value()) ||
            (!newRule.useCell.name.empty() && !curRule.useCell.name.empty())) {

            auto& diag = scope->addDiag(diag::DupConfigRule, newRule.syntax->sourceRange())
                         << nameGetter();
            diag.addNote(diag::NotePreviousDefinition, curRule.syntax->sourceRange());
        }
        else {
            if (newRule.paramOverrides)
                curRule.paramOverrides = newRule.paramOverrides;
            if (newRule.liblist)
                curRule.liblist = newRule.liblist;
            if (!newRule.useCell.name.empty()) {
                // Note: prefer the source range to come from the rule that
                // supplies a use cell name, to make other reported errors easier
                // to understand.
                curRule.useCell = newRule.useCell;
                curRule.syntax = newRule.syntax;
            }
        }
    };

    for (auto ruleSyntax : syntax.rules) {
        switch (ruleSyntax->kind) {
            case SyntaxKind::DefaultConfigRule:
                defaultLiblist = buildLiblist(*ruleSyntax->as<DefaultConfigRuleSyntax>().liblist);
                break;
            case SyntaxKind::CellConfigRule: {
                auto& ccr = ruleSyntax->as<CellConfigRuleSyntax>();
                auto cellName = ccr.name->cell.valueText();
                if (cellName.empty())
                    break;

                auto rule = comp.emplace<ConfigRule>(buildRule(*ccr.ruleClause));

                auto& overrides = cellOverrides[cellName];
                if (auto libName = ccr.name->library.valueText(); !libName.empty()) {
                    auto specificLib = comp.getSourceLibrary(libName);
                    if (!specificLib) {
                        scope->addDiag(diag::WarnUnknownLibrary, ccr.name->library.range())
                            << libName;
                        break;
                    }

                    auto [it, inserted] = overrides.specificLibRules.emplace(specificLib, rule);
                    if (!inserted) {
                        mergeRules(*it->second, *rule, [&] {
                            return fmt::format("cell '{}.{}'", specificLib->name, cellName);
                        });
                    }
                }
                else if (overrides.defaultRule) {
                    mergeRules(*overrides.defaultRule, *rule,
                               [&] { return fmt::format("cell '{}'", cellName); });
                }
                else {
                    overrides.defaultRule = rule;
                }
                break;
            }
            case SyntaxKind::InstanceConfigRule: {
                auto& icr = ruleSyntax->as<InstanceConfigRuleSyntax>();
                const auto topName = icr.topModule.valueText();
                if (topName.empty())
                    break;

                if (!topCellNames.contains(topName)) {
                    scope->addDiag(diag::ConfigInstanceWrongTop, icr.topModule.range());
                    break;
                }

                bool bad = false;
                auto node = &instanceOverrides[topName];
                for (auto& part : icr.instanceNames) {
                    auto partName = part->name.valueText();
                    bad |= partName.empty();
                    node = &node->childNodes[partName];
                }

                if (bad)
                    break;

                auto rule = buildRule(*icr.ruleClause);
                if (!node->rule) {
                    // No rule here yet; copy into our allocator and save it.
                    node->rule = comp.emplace<ConfigRule>(rule);
                }
                else {
                    // Merge the two rules, or warn if we cannot.
                    mergeRules(*node->rule, rule, [&] {
                        std::string name = "instance '";
                        name += topName;
                        for (auto& part : icr.instanceNames) {
                            name.push_back('.');
                            name += part->name.valueText();
                        }
                        name.push_back('\'');
                        return name;
                    });
                }
                break;
            }
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto checkTopOverride = [&](const ConfigRule& rule) {
        if (!rule.useCell.name.empty())
            scope->addDiag(diag::ConfigOverrideTop, rule.syntax->sourceRange());
    };

    // Check if any overrides should apply to the root instances.
    for (auto& [cellName, instOverride] : instanceOverrides) {
        if (instOverride.rule) {
            auto it = topCellNames.find(cellName);
            SLANG_ASSERT(it != topCellNames.end());
            checkTopOverride(*instOverride.rule);
            topCellsBuf[it->second].rule = instOverride.rule;
        }
    }

    for (auto& topCell : topCellsBuf) {
        // If we already set a rule for this cell via an instance
        // override we don't need a less specific cell override.
        if (topCell.rule)
            continue;

        if (auto it = cellOverrides.find(topCell.definition.name); it != cellOverrides.end()) {
            topCell.rule = it->second.defaultRule;
            auto& specificLibRules = it->second.specificLibRules;
            if (auto specificIt = specificLibRules.find(&topCell.definition.sourceLibrary);
                specificIt != specificLibRules.end()) {
                topCell.rule = specificIt->second;
            }

            if (topCell.rule)
                checkTopOverride(*topCell.rule);
        }
    }

    topCells = topCellsBuf.copy(comp);

    // Now that all rules have been resolved, go back through and
    // register them for later lookup by syntax.
    for (auto& [_, cellOverride] : cellOverrides) {
        if (cellOverride.defaultRule)
            ruleBySyntax[cellOverride.defaultRule->syntax] = cellOverride.defaultRule;

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            ruleBySyntax[rule->syntax] = rule;
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        registerRules(instOverride);
}